

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O1

void __thiscall QGroupBox::setChecked(QGroupBox *this,bool b)

{
  QGroupBoxPrivate *this_00;
  long in_FS_OFFSET;
  QAccessibleStateChangeEvent e;
  undefined1 local_69;
  code *local_68;
  undefined8 uStack_60;
  QGroupBox *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  void *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->checkable == true) && (this_00->checked != b)) {
    QWidget::update(&this->super_QWidget);
    this_00->checked = b;
    QGroupBoxPrivate::_q_setChildrenEnabled(this_00,b);
    uStack_50 = 0xaaaaaaaaffffffff;
    local_68 = QCss::ValueExtractor::extractGeometry;
    local_48 = 0x40;
    uStack_60 = 0xaaaaaaaa0000800a;
    local_58 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
    puStack_30 = &local_69;
    local_38 = (void *)0x0;
    local_69 = b;
    QMetaObject::activate((QObject *)this,&staticMetaObject,2,&local_38);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::setChecked(bool b)
{
    Q_D(QGroupBox);
    if (d->checkable && b != d->checked) {
        update();
        d->checked = b;
        d->_q_setChildrenEnabled(b);
#if QT_CONFIG(accessibility)
        QAccessible::State st;
        st.checked = true;
        QAccessibleStateChangeEvent e(this, st);
        QAccessible::updateAccessibility(&e);
#endif
        emit toggled(b);
    }
}